

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue JS_IteratorNext(JSContext *ctx,JSValue enum_obj,JSValue method,int argc,JSValue *argv,
                       BOOL *pdone)

{
  int iVar1;
  JSValueUnion JVar2;
  uint uVar3;
  ulong uVar4;
  undefined4 in_register_0000008c;
  int *piVar5;
  JSValue JVar6;
  JSValue JVar7;
  int done;
  int local_34;
  
  piVar5 = (int *)CONCAT44(in_register_0000008c,argc);
  JVar6 = JS_IteratorNext2(ctx,enum_obj,method,0,(JSValue *)0x0,&local_34);
  JVar2 = JVar6.u;
  uVar3 = (uint)JVar6.tag;
  if (uVar3 != 6) {
    if (local_34 != 2) {
      *piVar5 = local_34;
      uVar4 = (ulong)JVar2.ptr & 0xffffffff00000000;
      JVar7 = JVar6;
      goto LAB_0013c747;
    }
    JVar7 = JS_GetPropertyInternal(ctx,JVar6,0x69,JVar6,0);
    if ((int)JVar7.tag != 6) {
      iVar1 = JS_ToBoolFree(ctx,JVar7);
      *piVar5 = iVar1;
      if (iVar1 == 0) {
        JVar7 = JS_GetPropertyInternal(ctx,JVar6,0x40,JVar6,0);
        uVar4 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
      }
      else {
        JVar7 = (JSValue)(ZEXT816(3) << 0x40);
        uVar4 = 0;
      }
      if ((0xfffffff4 < uVar3) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar6);
      }
      goto LAB_0013c747;
    }
  }
  if ((0xfffffff4 < uVar3) && (iVar1 = *JVar2.ptr, *(int *)JVar2.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar6);
  }
  *piVar5 = 0;
  uVar4 = 0;
  JVar7 = (JSValue)(ZEXT816(6) << 0x40);
LAB_0013c747:
  JVar6.u.ptr = (void *)((ulong)JVar7.u.ptr & 0xffffffff | uVar4);
  JVar6.tag = JVar7.tag;
  return JVar6;
}

Assistant:

static JSValue JS_IteratorNext(JSContext *ctx, JSValueConst enum_obj,
                               JSValueConst method,
                               int argc, JSValueConst *argv, BOOL *pdone)
{
    JSValue obj, value, done_val;
    int done;

    obj = JS_IteratorNext2(ctx, enum_obj, method, argc, argv, &done);
    if (JS_IsException(obj))
        goto fail;
    if (done != 2) {
        *pdone = done;
        return obj;
    } else {
        done_val = JS_GetProperty(ctx, obj, JS_ATOM_done);
        if (JS_IsException(done_val))
            goto fail;
        *pdone = JS_ToBoolFree(ctx, done_val);
        value = JS_UNDEFINED;
        if (!*pdone) {
            value = JS_GetProperty(ctx, obj, JS_ATOM_value);
        }
        JS_FreeValue(ctx, obj);
        return value;
    }
 fail:
    JS_FreeValue(ctx, obj);
    *pdone = FALSE;
    return JS_EXCEPTION;
}